

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::moveAppend
          (QGenericArrayOps<VkSpecParser::TypedName> *this,TypedName *b,TypedName *e)

{
  qsizetype *pqVar1;
  TypedName *pTVar2;
  
  if (b != e) {
    pTVar2 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
    for (; b < e; b = b + 1) {
      VkSpecParser::TypedName::TypedName
                (pTVar2 + (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }